

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoMeEdgeCalculator.cpp
# Opt level: O3

bool __thiscall
NoMeEdgeCalculator::edgeBetween
          (NoMeEdgeCalculator *this,AlignmentRecord *ap1,AlignmentRecord *ap2,int numGCAllowedPos,
          int ct)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long lVar3;
  bool bVar4;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar2 = AlignmentRecord::isStrand1(ap1);
  if (((!bVar2) || (bVar2 = AlignmentRecord::isStrand1(ap2), bVar2)) &&
     ((bVar2 = AlignmentRecord::isStrand1(ap1), bVar2 ||
      (bVar2 = AlignmentRecord::isStrand1(ap2), !bVar2)))) {
    AlignmentRecord::getName_abi_cxx11_(&local_90,ap1);
    lVar3 = std::__cxx11::string::find((char *)&local_90,0x19881e,0);
    bVar2 = true;
    if (lVar3 == -1) {
      AlignmentRecord::getName_abi_cxx11_(&local_b0,ap2);
      lVar3 = std::__cxx11::string::find((char *)&local_b0,0x19881e,0);
      bVar2 = lVar3 != -1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
    }
    paVar1 = &local_90.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    AlignmentRecord::getCode1_abi_cxx11_(&local_90,ap1);
    lVar3 = std::__cxx11::string::find((char *)&local_90,0x19a4e0,0);
    bVar4 = true;
    if (lVar3 == -1) {
      AlignmentRecord::getCode1_abi_cxx11_(&local_b0,ap1);
      lVar3 = std::__cxx11::string::find((char *)&local_b0,0x19a4dd,0);
      bVar4 = true;
      if (lVar3 == -1) {
        AlignmentRecord::getCode2_abi_cxx11_(&local_50,ap1);
        lVar3 = std::__cxx11::string::find((char *)&local_50,0x19a4e0,0);
        bVar4 = true;
        if (lVar3 == -1) {
          AlignmentRecord::getCode2_abi_cxx11_(&local_70,ap1);
          lVar3 = std::__cxx11::string::find((char *)&local_70,0x19a4dd,0);
          bVar4 = lVar3 != -1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if (bVar4) {
      AlignmentRecord::getCode1_abi_cxx11_(&local_90,ap2);
      lVar3 = std::__cxx11::string::find((char *)&local_90,0x19a4e0,0);
      bVar4 = true;
      if (lVar3 == -1) {
        AlignmentRecord::getCode1_abi_cxx11_(&local_b0,ap2);
        lVar3 = std::__cxx11::string::find((char *)&local_b0,0x19a4dd,0);
        bVar4 = true;
        if (lVar3 == -1) {
          AlignmentRecord::getCode2_abi_cxx11_(&local_50,ap2);
          lVar3 = std::__cxx11::string::find((char *)&local_50,0x19a4e0,0);
          bVar4 = true;
          if (lVar3 == -1) {
            AlignmentRecord::getCode2_abi_cxx11_(&local_70,ap2);
            lVar3 = std::__cxx11::string::find((char *)&local_70,0x19a4dd,0);
            bVar4 = lVar3 != -1;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if (bVar4) {
        bVar2 = scoreReads(this,ap1,ap2,bVar2,numGCAllowedPos,ct);
        return bVar2;
      }
    }
  }
  return false;
}

Assistant:

bool NoMeEdgeCalculator::edgeBetween(const AlignmentRecord & ap1, const AlignmentRecord & ap2, int numGCAllowedPos, int ct) const{
    if (ap1.isStrand1()&& !ap2.isStrand1()) {
        return false;
    }else if (!ap1.isStrand1()&& ap2.isStrand1()) {
        return false;
    }
    bool isClique = false;
    if((ap1.getName().find("Clique")!=std::string::npos)||(ap2.getName().find("Clique")!=std::string::npos)){
        isClique = true;
    }


      //For Ideal Graph. Assumes that the reads have chroma1 or chroma2 written in their names
//    if((ap1.getName().find("chroma1") != std::string::npos && ap2.getName().find("chroma1") != std::string::npos) || (ap1.getName().find("chroma2") != std::string::npos && ap2.getName().find("chroma2") != std::string::npos)){
//        if(((ap1.getCode1().find("C") != std::string::npos) || (ap1.getCode1().find("O") != std::string::npos)) || ((ap1.getCode2().find("C") != std::string::npos) || (ap1.getCode2().find("O") != std::string::npos))){
//            if(((ap2.getCode1().find("C") != std::string::npos) || (ap2.getCode1().find("O") != std::string::npos)) || ((ap2.getCode2().find("C") != std::string::npos) || (ap2.getCode2().find("O") != std::string::npos))){
//                if(scoreReads(ap1,ap2, isClique,numGCAllowedPos,ct)){
//                    return true;
//                }else{
//                    return false;
//                }
//            }else{
//                return false;
//            }
//        }else{
//            return false;
//        }
//    }else{
//        return false;
//    }

    //For normal edge criterion
    if(((ap1.getCode1().find("C") != std::string::npos) || (ap1.getCode1().find("O") != std::string::npos)) || ((ap1.getCode2().find("C") != std::string::npos) || (ap1.getCode2().find("O") != std::string::npos))){
        if(((ap2.getCode1().find("C") != std::string::npos) || (ap2.getCode1().find("O") != std::string::npos)) || ((ap2.getCode2().find("C") != std::string::npos) || (ap2.getCode2().find("O") != std::string::npos))){
            if(scoreReads(ap1,ap2, isClique,numGCAllowedPos,ct)){
                return true;
            }else{
                return false;
            }
        }else{
            return false;
        }
    }else{
        return false;
    }
}